

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall piksel::Graphics::background(Graphics *this,vec4 color)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  _Elt_pointer pSVar2;
  
  push(this);
  fill(this,color);
  noStroke(this);
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  pSVar2[-1].shaderIrrelevantState.rectMode = CORNER;
  rect(this,0.0,0.0,(float)*this->framebufferWidth,(float)*this->framebufferHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::background(glm::vec4 color) {
    push();
    fill(color);
    noStroke();
    rectMode(DrawMode::CORNER);
    rect(0.0f, 0.0f, framebufferWidth, framebufferHeight);
    pop();
}